

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O1

void cfgSet(dataRefsLT idx,int v)

{
  XPLMDataRef pvVar1;
  LTError *this;
  
  if (DR_CHANNEL_REAL_TRAFFIC_ONLINE < idx) {
    this = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(this,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTImgWindow.cpp"
                     ,0x2d,"cfgSet",logFATAL,"ASSERT FAILED: %s","0 <= idx && idx < CNT_DATAREFS_LT"
                    );
    __cxa_throw(this,&LTError::typeinfo,std::logic_error::~logic_error);
  }
  if (gDR[idx] == (XPLMDataRef)0x0) {
    pvVar1 = (XPLMDataRef)XPLMFindDataRef(DATA_REFS_LT[idx].dataName._M_dataplus._M_p);
    gDR[idx] = pvVar1;
  }
  if (gDR[idx] != (XPLMDataRef)0x0) {
    XPLMSetDatai(gDR[idx],v);
    return;
  }
  return;
}

Assistant:

void cfgSet (dataRefsLT idx, int v)
{
    LOG_ASSERT(0 <= idx && idx < CNT_DATAREFS_LT);
    if (!gDR[idx])
        gDR[idx] = XPLMFindDataRef(DATA_REFS_LT[idx]);
    if (gDR[idx]) XPLMSetDatai(gDR[idx], v);
}